

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::internal::require_numeric_argument(Arg *arg,char spec)

{
  undefined8 uVar1;
  long in_RDI;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  CStringRef message_00;
  BasicCStringRef<char> local_38;
  BasicCStringRef<char> in_stack_ffffffffffffffd0;
  CStringRef in_stack_ffffffffffffffd8;
  
  if (9 < *(int *)(in_RDI + 0x10)) {
    BasicCStringRef<char>::BasicCStringRef
              (&local_38,"format specifier \'{}\' requires numeric argument");
    message_00.data_ = &stack0xffffffffffffffd0;
    format<char>(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0.data_);
    uVar1 = __cxa_allocate_exception(0x10);
    BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)message_00.data_,in_stack_ffffffffffffff98);
    FormatError::FormatError((FormatError *)in_stack_ffffffffffffff98,message_00);
    __cxa_throw(uVar1,&FormatError::typeinfo,FormatError::~FormatError);
  }
  return;
}

Assistant:

inline void require_numeric_argument(const Arg &arg, char spec) {
  if (arg.type > Arg::LAST_NUMERIC_TYPE) {
    std::string message =
        fmt::format("format specifier '{}' requires numeric argument", spec);
    FMT_THROW(fmt::FormatError(message));
  }
}